

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffiblk(fitsfile *fptr,long nblock,int headdata,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  LONGLONG *pLVar3;
  undefined1 *puVar4;
  int iVar5;
  int iVar6;
  undefined1 *buffer;
  long lVar7;
  long lVar8;
  byte bVar9;
  LONGLONG bytepos;
  undefined1 *__s;
  long lVar10;
  int typhdu;
  char card [81];
  char buff2 [2880];
  char buff1 [2880];
  int local_1724;
  long local_1720;
  char local_1718 [96];
  undefined1 local_16b8 [2880];
  undefined1 local_b78 [2888];
  
  iVar6 = *status;
  if (0 < nblock && iVar6 < 1) {
    if (headdata == 0) {
      bVar9 = 0x20;
      bytepos = fptr->Fptr->datastart;
    }
    else {
      bVar9 = (fptr->Fptr->hdutype == 1) << 5;
      if (headdata == -1) {
        builtin_strncpy(local_1718 + 0x20,"IMAGE extension",0x10);
        builtin_strncpy(local_1718 + 0x10,"   \'          / ",0x10);
        builtin_strncpy(local_1718,"XTENSION= \'IMAGE",0x10);
        bytepos = 0;
      }
      else {
        pFVar2 = fptr->Fptr;
        bytepos = ((pFVar2->heapstart + pFVar2->datastart + pFVar2->heapsize + 0xb3f) / 0xb40) *
                  0xb40;
      }
    }
    __s = local_16b8;
    memset(__s,(uint)bVar9,0xb40);
    if (nblock == 1) {
      if (headdata == -1) {
        ffmrec(fptr,1,local_1718,status);
      }
      ffmbyt(fptr,bytepos,0,status);
      ffgbyt(fptr,0xb40,local_b78,status);
      if (*status < 1) {
        puVar4 = local_16b8;
        buffer = local_b78;
        do {
          __s = buffer;
          buffer = puVar4;
          ffmbyt(fptr,bytepos,0,status);
          ffpbyt(fptr,0xb40,buffer,status);
          if (0 < *status) {
            return *status;
          }
          bytepos = bytepos + 0xb40;
          ffmbyt(fptr,bytepos,0,status);
          ffgbyt(fptr,0xb40,buffer,status);
          puVar4 = __s;
        } while (*status < 1);
      }
      *status = iVar6;
      ffmbyt(fptr,bytepos,1,status);
      ffpbyt(fptr,0xb40,__s,status);
    }
    else {
      iVar1 = fptr->Fptr->curhdu;
      iVar5 = *status;
      local_1720 = nblock;
      if (iVar5 < 1) {
        do {
          ffmahd(fptr,fptr->HDUposition + 2,&local_1724,status);
          iVar5 = *status;
        } while (iVar5 < 1);
      }
      if (iVar5 == 0x6b) {
        *status = iVar6;
      }
      ffmahd(fptr,iVar1 + 1,&local_1724,status);
      if (headdata == -1) {
        ffmrec(fptr,1,local_1718,status);
      }
      lVar8 = fptr->Fptr->headstart[(long)fptr->Fptr->maxhdu + 1];
      if (0xb3f < lVar8 - bytepos) {
        lVar10 = (lVar8 - bytepos) / 0xb40;
        lVar7 = local_1720 * 0xb40;
        do {
          lVar8 = lVar8 + -0xb40;
          iVar6 = ffmbyt(fptr,lVar8,0,status);
          if (0 < iVar6) goto LAB_0013bdcc;
          ffgbyt(fptr,0xb40,local_b78,status);
          ffmbyt(fptr,lVar7 + lVar8,1,status);
          ffpbyt(fptr,0xb40,local_b78,status);
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      ffmbyt(fptr,bytepos,1,status);
      nblock = local_1720;
      if (0 < local_1720) {
        lVar8 = local_1720;
        do {
          ffpbyt(fptr,0xb40,local_16b8,status);
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
    }
    if (headdata == 0) {
      pLVar3 = &fptr->Fptr->datastart;
      *pLVar3 = *pLVar3 + nblock * 0xb40;
    }
    pFVar2 = fptr->Fptr;
    iVar6 = pFVar2->maxhdu;
    if (pFVar2->curhdu <= iVar6) {
      pLVar3 = pFVar2->headstart;
      lVar8 = (long)pFVar2->curhdu + -1;
      do {
        pLVar3[lVar8 + 2] = pLVar3[lVar8 + 2] + nblock * 0xb40;
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar6);
    }
LAB_0013bdcc:
    iVar6 = *status;
  }
  return iVar6;
}

Assistant:

int ffiblk(fitsfile *fptr,      /* I - FITS file pointer               */
           long nblock,         /* I - no. of blocks to insert         */ 
           int headdata,        /* I - insert where? 0=header, 1=data  */
                                /*     -1=beginning of file            */
           int *status)         /* IO - error status                   */
/*
   insert 2880-byte blocks at the end of the current header or data unit
*/
{
    int tstatus, savehdu, typhdu;
    LONGLONG insertpt, jpoint;
    long ii, nshift;
    char charfill;
    char buff1[2880], buff2[2880];
    char *inbuff, *outbuff, *tmpbuff;
    char card[FLEN_CARD];

    if (*status > 0 || nblock <= 0)
        return(*status);
        
    tstatus = *status;

    if (headdata == 0 || (fptr->Fptr)->hdutype == ASCII_TBL)
        charfill = 32;  /* headers and ASCII tables have space (32) fill */
    else
        charfill = 0;   /* images and binary tables have zero fill */

    if (headdata == 0)  
        insertpt = (fptr->Fptr)->datastart;  /* insert just before data, or */
    else if (headdata == -1)
    {
        insertpt = 0;
        strcpy(card, "XTENSION= 'IMAGE   '          / IMAGE extension");
    }
    else                                     /* at end of data, */
    {
        insertpt = (fptr->Fptr)->datastart + 
                   (fptr->Fptr)->heapstart + 
                   (fptr->Fptr)->heapsize;
        insertpt = ((insertpt + 2879) / 2880) * 2880; /* start of block */

       /* the following formula is wrong because the current data unit
          may have been extended without updating the headstart value
          of the following HDU.
       */
       /* insertpt = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu + 1]; */
    }

    inbuff  = buff1;   /* set pointers to input and output buffers */
    outbuff = buff2;

    memset(outbuff, charfill, 2880); /* initialize buffer with fill */

    if (nblock == 1)  /* insert one block */
    {
      if (headdata == -1)
        ffmrec(fptr, 1, card, status);    /* change SIMPLE -> XTENSION */

      ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* move to 1st point */
      ffgbyt(fptr, 2880, inbuff, status);  /* read first block of bytes */

      while (*status <= 0)
      {
        ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* insert point */
        ffpbyt(fptr, 2880, outbuff, status);  /* write the output buffer */

        if (*status > 0)
            return(*status);

        tmpbuff = inbuff;   /* swap input and output pointers */
        inbuff = outbuff;
        outbuff = tmpbuff;
        insertpt += 2880;  /* increment insert point by 1 block */

        ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* move to next block */
        ffgbyt(fptr, 2880, inbuff, status);  /* read block of bytes */
      }

      *status = tstatus;  /* reset status value */
      ffmbyt(fptr, insertpt, IGNORE_EOF, status); /* move back to insert pt */
      ffpbyt(fptr, 2880, outbuff, status);  /* write the final block */
    }

    else   /*  inserting more than 1 block */

    {
        savehdu = (fptr->Fptr)->curhdu;  /* save the current HDU number */
        tstatus = *status;
        while(*status <= 0)  /* find the last HDU in file */
              ffmrhd(fptr, 1, &typhdu, status);

        if (*status == END_OF_FILE)
        {
            *status = tstatus;
        }

        ffmahd(fptr, savehdu + 1, &typhdu, status);  /* move back to CHDU */
        if (headdata == -1)
          ffmrec(fptr, 1, card, status); /* NOW change SIMPLE -> XTENSION */

        /* number of 2880-byte blocks that have to be shifted down */
        nshift = (long) (((fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1] - insertpt)
                 / 2880);
        /* position of last block in file to be shifted */
        jpoint =  (fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1] - 2880;

        /* move all the blocks starting at end of file working backwards */
        for (ii = 0; ii < nshift; ii++)
        {
            /* move to the read start position */
            if (ffmbyt(fptr, jpoint, REPORT_EOF, status) > 0)
                return(*status);

            ffgbyt(fptr, 2880, inbuff,status);  /* read one record */

            /* move forward to the write postion */
            ffmbyt(fptr, jpoint + ((LONGLONG) nblock * 2880), IGNORE_EOF, status);

            ffpbyt(fptr, 2880, inbuff, status);  /* write the record */

            jpoint -= 2880;
        }

        /* move back to the write start postion (might be EOF) */
        ffmbyt(fptr, insertpt, IGNORE_EOF, status);

        for (ii = 0; ii < nblock; ii++)   /* insert correct fill value */
             ffpbyt(fptr, 2880, outbuff, status);
    }

    if (headdata == 0)         /* update data start address */
      (fptr->Fptr)->datastart += ((LONGLONG) nblock * 2880);

    /* update following HDU addresses */
    for (ii = (fptr->Fptr)->curhdu; ii <= (fptr->Fptr)->maxhdu; ii++)
         (fptr->Fptr)->headstart[ii + 1] += ((LONGLONG) nblock * 2880);

    return(*status);
}